

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::AssemblyContext::spvNamedIdAssignOrGet(AssemblyContext *this,char *textValue)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  uint uVar4;
  uint32_t id;
  allocator<char> local_49;
  key_type local_48;
  char *local_28;
  
  local_28 = textValue;
  if ((this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_48._M_dataplus._M_p._0_4_ = 0;
    bVar1 = utils::ParseNumber<unsigned_int>(textValue,(uint *)&local_48);
    if ((bVar1) &&
       (iVar2 = std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::find(&(this->ids_to_preserve_)._M_t,(key_type *)&local_48),
       (_Rb_tree_header *)iVar2._M_node !=
       &(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header)) goto LAB_005476d9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,textValue,&local_49);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_48);
  std::__cxx11::string::_M_dispose();
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                   ._M_cur + 0x28);
  }
  local_48._M_dataplus._M_p._0_4_ = this->next_id_;
  this->next_id_ = (uint32_t)local_48._M_dataplus._M_p + 1;
  if ((this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    while (iVar2 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::find(&(this->ids_to_preserve_)._M_t,(key_type *)&local_48),
          (_Rb_tree_header *)iVar2._M_node !=
          &(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header) {
      local_48._M_dataplus._M_p._0_4_ = this->next_id_;
      this->next_id_ = (uint32_t)local_48._M_dataplus._M_p + 1;
    }
  }
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const*&,unsigned_int&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&local_28,&local_48);
LAB_005476d9:
  uVar4 = (uint32_t)local_48._M_dataplus._M_p + 1;
  if ((uint32_t)local_48._M_dataplus._M_p + 1 < this->bound_) {
    uVar4 = this->bound_;
  }
  this->bound_ = uVar4;
  return (uint32_t)local_48._M_dataplus._M_p;
}

Assistant:

uint32_t AssemblyContext::spvNamedIdAssignOrGet(const char* textValue) {
  if (!ids_to_preserve_.empty()) {
    uint32_t id = 0;
    if (spvtools::utils::ParseNumber(textValue, &id)) {
      if (ids_to_preserve_.find(id) != ids_to_preserve_.end()) {
        bound_ = std::max(bound_, id + 1);
        return id;
      }
    }
  }

  const auto it = named_ids_.find(textValue);
  if (it == named_ids_.end()) {
    uint32_t id = next_id_++;
    if (!ids_to_preserve_.empty()) {
      while (ids_to_preserve_.find(id) != ids_to_preserve_.end()) {
        id = next_id_++;
      }
    }

    named_ids_.emplace(textValue, id);
    bound_ = std::max(bound_, id + 1);
    return id;
  }

  return it->second;
}